

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImage.cpp
# Opt level: O0

void __thiscall
irr::video::CImage::copyToScalingBoxFilter(CImage *this,IImage *target,s32 bias,bool blend)

{
  dimension2d<unsigned_int> dVar1;
  uint uVar2;
  bool bVar3;
  s32 x_00;
  s32 y_00;
  dimension2d<unsigned_int> *pdVar4;
  byte in_CL;
  IImage *in_RSI;
  long in_RDI;
  float fVar5;
  float fVar6;
  double __x;
  u32 x;
  u32 y;
  f32 sy;
  f32 sx;
  s32 fy;
  s32 fx;
  f32 sourceYStep;
  f32 sourceXStep;
  dimension2d<unsigned_int> destSize;
  u32 local_44;
  uint local_40;
  uint uVar7;
  uint bias_00;
  float fy_00;
  float fx_00;
  uint local_20;
  uint uStack_1c;
  
  bVar3 = IImage::isCompressedFormat(*(ECOLOR_FORMAT *)(in_RDI + 8));
  if (bVar3) {
    os::Printer::log((Printer *)
                     "IImage::copyToScalingBoxFilter method doesn\'t work with compressed images.",
                     __x);
  }
  else {
    pdVar4 = IImage::getDimension(in_RSI);
    dVar1 = *pdVar4;
    fVar5 = (float)*(uint *)(in_RDI + 0xc) / (float)((ulong)dVar1 & 0xffffffff);
    fVar6 = (float)*(uint *)(in_RDI + 0x10) / (float)((ulong)dVar1 >> 0x20);
    x_00 = core::ceil32(0.0);
    y_00 = core::ceil32(0.0);
    fy_00 = 0.0;
    for (uVar7 = 0; uStack_1c = dVar1.Height, uVar7 != uStack_1c; uVar7 = uVar7 + 1) {
      fx_00 = 0.0;
      for (local_40 = 0; uVar2 = local_40, local_20 = dVar1.Width, local_40 != local_20;
          local_40 = local_40 + 1) {
        bias_00 = uVar7;
        core::floor32(0.0);
        core::floor32(0.0);
        local_44 = (u32)getPixelBox((CImage *)CONCAT44(fVar5,fVar6),x_00,y_00,(s32)fx_00,(s32)fy_00,
                                    bias_00);
        (*in_RSI->_vptr_IImage[3])(in_RSI,(ulong)uVar2,(ulong)uVar7,&local_44,(ulong)(in_CL & 1));
        fx_00 = fVar5 + fx_00;
        uVar7 = bias_00;
      }
      fy_00 = fVar6 + fy_00;
    }
  }
  return;
}

Assistant:

void CImage::copyToScalingBoxFilter(IImage *target, s32 bias, bool blend)
{
	if (IImage::isCompressedFormat(Format)) {
		os::Printer::log("IImage::copyToScalingBoxFilter method doesn't work with compressed images.", ELL_WARNING);
		return;
	}

	const core::dimension2d<u32> destSize = target->getDimension();

	const f32 sourceXStep = (f32)Size.Width / (f32)destSize.Width;
	const f32 sourceYStep = (f32)Size.Height / (f32)destSize.Height;

	s32 fx = core::ceil32(sourceXStep);
	s32 fy = core::ceil32(sourceYStep);
	f32 sx;
	f32 sy;

	sy = 0.f;
	for (u32 y = 0; y != destSize.Height; ++y) {
		sx = 0.f;
		for (u32 x = 0; x != destSize.Width; ++x) {
			target->setPixel(x, y,
					getPixelBox(core::floor32(sx), core::floor32(sy), fx, fy, bias), blend);
			sx += sourceXStep;
		}
		sy += sourceYStep;
	}
}